

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

void __thiscall irr::video::CImage::setPixel(CImage *this,u32 x,u32 y,SColor *color,bool blend)

{
  int iVar1;
  long lVar2;
  u16 uVar3;
  u32 uVar4;
  undefined1 *puVar5;
  u32 *puVar6;
  SColor *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  byte in_R8B;
  double in_XMM0_Qa;
  u32 *dest_3;
  u8 *dest_2;
  u16 *dest_1;
  u16 *dest;
  u32 local_54;
  
  if ((in_ESI < *(uint *)(in_RDI + 0xc)) && (in_EDX < *(uint *)(in_RDI + 0x10))) {
    switch(*(undefined4 *)(in_RDI + 8)) {
    case 0:
      lVar2 = *(long *)(in_RDI + 0x18);
      iVar1 = *(int *)(in_RDI + 0x2c);
      uVar3 = A8R8G8B8toA1R5G5B5(in_RCX->color);
      *(u16 *)(lVar2 + (ulong)(in_EDX * iVar1) + (ulong)(in_ESI << 1)) = uVar3;
      break;
    case 1:
      lVar2 = *(long *)(in_RDI + 0x18);
      iVar1 = *(int *)(in_RDI + 0x2c);
      uVar3 = A8R8G8B8toR5G6B5(in_RCX->color);
      *(u16 *)(lVar2 + (ulong)(in_EDX * iVar1) + (ulong)(in_ESI << 1)) = uVar3;
      break;
    case 2:
      puVar5 = (undefined1 *)
               (*(long *)(in_RDI + 0x18) + (ulong)(in_EDX * *(int *)(in_RDI + 0x2c)) +
               (ulong)(in_ESI * 3));
      uVar4 = SColor::getRed(in_RCX);
      *puVar5 = (char)uVar4;
      uVar4 = SColor::getGreen(in_RCX);
      puVar5[1] = (char)uVar4;
      uVar4 = SColor::getBlue(in_RCX);
      puVar5[2] = (char)uVar4;
      break;
    case 3:
      puVar6 = (u32 *)(*(long *)(in_RDI + 0x18) + (ulong)(in_EDX * *(int *)(in_RDI + 0x2c)) +
                      (ulong)(in_ESI << 2));
      if ((in_R8B & 1) == 0) {
        local_54 = in_RCX->color;
      }
      else {
        local_54 = PixelBlend32(*puVar6,in_RCX->color);
      }
      *puVar6 = local_54;
      break;
    default:
      break;
    case 0x11:
      os::Printer::log((Printer *)"IImage::setPixel unknown format.",in_XMM0_Qa);
    }
  }
  return;
}

Assistant:

void CImage::setPixel(u32 x, u32 y, const SColor &color, bool blend)
{
	if (x >= Size.Width || y >= Size.Height)
		return;

	switch (Format) {
	case ECF_A1R5G5B5: {
		u16 *dest = (u16 *)(Data + (y * Pitch) + (x << 1));
		*dest = video::A8R8G8B8toA1R5G5B5(color.color);
	} break;

	case ECF_R5G6B5: {
		u16 *dest = (u16 *)(Data + (y * Pitch) + (x << 1));
		*dest = video::A8R8G8B8toR5G6B5(color.color);
	} break;

	case ECF_R8G8B8: {
		u8 *dest = Data + (y * Pitch) + (x * 3);
		dest[0] = (u8)color.getRed();
		dest[1] = (u8)color.getGreen();
		dest[2] = (u8)color.getBlue();
	} break;

	case ECF_A8R8G8B8: {
		u32 *dest = (u32 *)(Data + (y * Pitch) + (x << 2));
		*dest = blend ? PixelBlend32(*dest, color.color) : color.color;
	} break;

	case ECF_UNKNOWN:
		os::Printer::log("IImage::setPixel unknown format.", ELL_WARNING);
		return;

	default:
		break;
	}
}